

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_benchmark.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *file_name;
  _Alloc_hider _Var1;
  size_type sVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  ostream *poVar6;
  size_t sVar7;
  runtime_error *this;
  long *plVar8;
  undefined8 uVar9;
  pointer ppVar10;
  long lVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>
  __l;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>
  tests;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2a8;
  pointer local_290;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_288;
  long local_270;
  pointer local_268;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>
  local_260;
  long *local_248 [2];
  long local_238 [2];
  double local_228;
  double dStack_220;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
  local_218;
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  code *local_1d0;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  code *local_1a8;
  undefined1 *local_1a0 [2];
  undefined1 local_190 [16];
  code *local_180;
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  code *local_158;
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  code *local_130;
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  code *local_108;
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  code *local_e0;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  code *local_b8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  code *local_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  code *local_68;
  long *local_60 [2];
  long local_50 [2];
  code *local_40;
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Pass a filename to read\n",0x18);
    iVar4 = 1;
  }
  else {
    file_name = argv[1];
    if (argc == 2) {
      bVar12 = false;
    }
    else {
      local_248[0] = local_238;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"check","");
      iVar4 = std::__cxx11::string::compare((char *)local_248);
      bVar12 = iVar4 == 0;
      if (local_248[0] != local_238) {
        operator_delete(local_248[0],local_238[0] + 1);
      }
    }
    local_218.first._M_dataplus._M_p = (pointer)&local_218.first.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_218,"stdio incremental read","");
    local_218.second = anon_unknown.dwarf_bc6e::read_stdio_inc;
    local_1f0[0] = local_1e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f0,"modern::io incremental read","");
    local_1d0 = anon_unknown.dwarf_bc6e::read_modern_inc;
    local_1c8[0] = local_1b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"stdio preallocated read","");
    local_1a8 = anon_unknown.dwarf_bc6e::read_stdio_prealloc;
    local_1a0[0] = local_190;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a0,"iostream preallocated read","");
    local_180 = anon_unknown.dwarf_bc6e::read_iostream_prealloc;
    local_178[0] = local_168;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_178,"modern::io preallocated read","");
    local_158 = anon_unknown.dwarf_bc6e::read_modern_prealloc;
    local_150[0] = local_140;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_150,"modern::io preallocated mmap read","");
    local_130 = anon_unknown.dwarf_bc6e::read_modern_mmap_prealloc;
    local_128[0] = local_118;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"iostream incremental range read","");
    local_108 = anon_unknown.dwarf_bc6e::read_iostream_range;
    local_100[0] = local_f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,"modern::io incremental range read","");
    local_e0 = anon_unknown.dwarf_bc6e::read_modern_range;
    local_d8[0] = local_c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"modern::io incremental mmap range read","");
    local_b8 = anon_unknown.dwarf_bc6e::read_modern_mmap_range;
    local_b0[0] = local_a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b0,"iostream preallocated range read","");
    local_90 = anon_unknown.dwarf_bc6e::read_iostream_range_prealloc;
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"modern::io preallocated range read","");
    local_68 = anon_unknown.dwarf_bc6e::read_modern_range_prealloc;
    plVar8 = local_50;
    local_60[0] = plVar8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_60,"modern::io preallocated mmap range read","");
    local_40 = anon_unknown.dwarf_bc6e::read_modern_mmap_range_prealloc;
    __l._M_len = 0xc;
    __l._M_array = &local_218;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>
    ::vector(&local_260,__l,(allocator_type *)&local_288);
    lVar11 = -0x1e0;
    do {
      if (plVar8 != (long *)plVar8[-2]) {
        operator_delete((long *)plVar8[-2],*plVar8 + 1);
      }
      plVar8 = plVar8 + -5;
      lVar11 = lVar11 + 0x28;
    } while (lVar11 != 0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"warming cache and checking disk speed... ",0x29);
    std::ostream::flush();
    lVar11 = std::chrono::_V2::system_clock::now();
    anon_unknown.dwarf_bc6e::read_stdio_inc
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_218,file_name);
    lVar5 = std::chrono::_V2::system_clock::now();
    uVar3 = local_218.first.field_2._M_allocated_capacity;
    sVar2 = local_218.first._M_string_length;
    _Var1._M_p = local_218.first._M_dataplus._M_p;
    local_290 = (pointer)0x0;
    local_2a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    uVar9 = 0;
    if (bVar12) {
      local_218.first._M_dataplus._M_p = (pointer)0x0;
      local_218.first._M_string_length = 0;
      local_218.first.field_2._M_allocated_capacity = 0;
      local_290 = (pointer)sVar2;
      local_2a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var1._M_p;
      uVar9 = uVar3;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done\n",5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218.first._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_218.first._M_dataplus._M_p,
                      local_218.first.field_2._M_allocated_capacity -
                      (long)local_218.first._M_dataplus._M_p);
    }
    lVar5 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2000000)) / SEXT816((lVar5 - lVar11) / 1000),0);
    lVar11 = 1;
    if (1 < lVar5) {
      lVar11 = lVar5;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Performing ",0xb);
    poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," read(s) of ",0xc);
    if (file_name == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen(file_name);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,file_name,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," (",2);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," bytes, ",8);
    lVar11 = lVar11 * (sVar2 - (long)_Var1._M_p);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," total) per test",0x10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    local_268 = local_260.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (local_260.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_260.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      auVar13._8_4_ = (int)((ulong)lVar11 >> 0x20);
      auVar13._0_8_ = lVar11;
      auVar13._12_4_ = 0x45300000;
      dStack_220 = auVar13._8_8_ - 1.9342813113834067e+25;
      if (lVar5 < 2) {
        lVar5 = 1;
      }
      local_228 = dStack_220 + ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
      ppVar10 = local_260.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_270 = lVar5;
      do {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(ppVar10->first)._M_dataplus._M_p,
                            (ppVar10->first)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        lVar5 = std::chrono::_V2::system_clock::now();
        local_218.first._M_dataplus._M_p = (pointer)0x0;
        local_218.first._M_string_length = 0;
        local_218.first.field_2._M_allocated_capacity = 0;
        lVar11 = local_270;
        do {
          (*ppVar10->second)(&local_288,file_name);
          uVar3 = local_218.first.field_2._M_allocated_capacity;
          _Var1._M_p = local_218.first._M_dataplus._M_p;
          local_218.first._M_dataplus._M_p =
               (pointer)local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          local_218.first._M_string_length =
               (size_type)
               local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_218.first.field_2._M_allocated_capacity =
               (size_type)
               local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var1._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(_Var1._M_p,uVar3 - (long)_Var1._M_p);
          }
          io::detail::black_box_impl(&local_218);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_288.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_288.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_288.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
        lVar11 = std::chrono::_V2::system_clock::now();
        if ((bVar12) &&
           ((local_218.first._M_string_length - (long)local_218.first._M_dataplus._M_p !=
             (long)local_290 - (long)local_2a8 ||
            (((pointer)local_218.first._M_string_length != local_218.first._M_dataplus._M_p &&
             (iVar4 = bcmp(local_218.first._M_dataplus._M_p,local_2a8,
                           local_218.first._M_string_length - (long)local_218.first._M_dataplus._M_p
                          ), iVar4 != 0)))))) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"read does not match reference output");
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"took ",5);
        poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"ms (",4);
        poVar6 = std::ostream::_M_insert<double>
                           (local_228 / ((double)((lVar11 - lVar5) / 1000000) * 1000.0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"MB/s)\n",6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218.first._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_218.first._M_dataplus._M_p,
                          local_218.first.field_2._M_allocated_capacity -
                          (long)local_218.first._M_dataplus._M_p);
        }
        ppVar10 = ppVar10 + 1;
      } while (ppVar10 != local_268);
    }
    if (local_2a8 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_2a8,uVar9 - (long)local_2a8);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>
    ::~vector(&local_260);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc < 2) {
        std::cout << "Pass a filename to read\n";
        return 1;
    }

    auto file_name = argv[1];
    const bool check = argc > 2 && argv[2] == std::string("check");

    using test_entry = std::pair<std::string, std::vector<std::uint8_t>(*)(const char*)>;
#ifdef _POSIX_VERSION
    const std::vector<test_entry> tests {
            { "stdio incremental read", read_stdio_inc },
            { "modern::io incremental read", read_modern_inc },
            { "stdio preallocated read", read_stdio_prealloc },
            { "iostream preallocated read", read_iostream_prealloc },
            { "modern::io preallocated read", read_modern_prealloc },
            { "modern::io preallocated mmap read", read_modern_mmap_prealloc },
            { "iostream incremental range read", read_iostream_range },
            { "modern::io incremental range read", read_modern_range },
            { "modern::io incremental mmap range read", read_modern_mmap_range },
            { "iostream preallocated range read", read_iostream_range_prealloc },
            { "modern::io preallocated range read", read_modern_range_prealloc },
            { "modern::io preallocated mmap range read", read_modern_mmap_range_prealloc },
    };
#else // !_POSIX_VERSION
    const std::vector<test_entry> tests {
            { "stdio incremental read", read_stdio_inc },
            { "modern::io incremental read", read_modern_inc },
            { "stdio preallocated read", read_stdio_prealloc },
            { "iostream preallocated read", read_iostream_prealloc },
            { "modern::io preallocated read", read_modern_prealloc },
            { "iostream incremental range read", read_iostream_range },
            { "modern::io incremental range read", read_modern_range },
            { "iostream preallocated range read", read_iostream_range_prealloc },
            { "modern::io preallocated range read", read_modern_range_prealloc },
    };
#endif // _POSIX_VERSION

    std::chrono::microseconds reference_time;
    std::size_t file_size = 0;

    std::vector<uint8_t> reference;
    {
        std::cout << "warming cache and checking disk speed... " << std::flush;
        timer t{};
        auto v = read_stdio_inc(file_name);
        reference_time = t.elapsed<std::chrono::microseconds>();
        file_size = v.size();
        if (check) {
            reference = std::move(v);
        }
        std::cout << "done\n";
    }

    // A good heuristic for meaningful results seems to be to make the fastest
    // tests take ~2 seconds
    auto n_times = std::max<long>(std::chrono::seconds{2}/reference_time, 1);

    std::cout << "Performing " << n_times << " read(s) of "
              << file_name << " (" << file_size << " bytes, "
              << file_size * n_times << " total) per test" << std::endl;

    for (const auto& test : tests) {
        std::cout << test.first << " ";
        try {
            auto t = timer{};
            std::vector<std::uint8_t> v;
            for (int i = 0; i < n_times; i++) {
                io::black_box(v = test.second(file_name));
            }
            auto e = t.elapsed();
            if (check && v != reference) {
                throw std::runtime_error{"read does not match reference output"};
            }
            std::cout << "took " << e.count() << "ms ("
                      << n_times * file_size/(1000.0 * e.count()) << "MB/s)\n";
        } catch (const std::exception& e){
            std::cout << "-- ERROR " << e.what() << "\n";
        }
    }
}